

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

char * deep_str_copy(char *src)

{
  size_t sVar1;
  void *__dest;
  char *pcVar2;
  
  if (src != (char *)0x0) {
    sVar1 = strlen(src);
    __dest = malloc(sVar1 + 1);
    pcVar2 = (char *)memcpy(__dest,src,sVar1 + 1);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

const char *deep_str_copy(const char *src) {
    if (!src) {
        return src;
    }
    size_t len = strlen(src) + 1;
    char *dst = malloc(len);
    memcpy(dst, src, len);
    return dst;
}